

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_unix_util.c
# Opt level: O3

PaError PaUnixThread_New(PaUnixThread *self,_func_void_ptr_void_ptr *threadFunc,void *threadArg,
                        PaTime waitForChild,int rtSched)

{
  pthread_cond_t *__cond;
  PaUnixMutex *__mutex;
  double dVar1;
  int iVar2;
  int *piVar3;
  PaError PVar4;
  char *pcVar5;
  double dVar6;
  int policy;
  sched_param spm;
  pthread_attr_t attr;
  timeval local_90;
  double local_80;
  timespec local_78;
  pthread_attr_t local_68;
  
  *(undefined8 *)((long)&self->cond + 0x20) = 0;
  *(undefined8 *)((long)&self->cond + 0x28) = 0;
  *(undefined8 *)((long)&self->cond + 0x10) = 0;
  *(undefined8 *)((long)&self->cond + 0x18) = 0;
  (self->cond).__align = 0;
  (self->cond).__data.__g1_start.__value64 = 0;
  (self->mtx).mtx.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (self->mtx).mtx.__data.__list.__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(self->mtx).mtx + 8) = 0;
  *(undefined8 *)((long)&(self->mtx).mtx + 0x10) = 0;
  *(undefined8 *)&self->locked = 0;
  (self->mtx).mtx.__align = 0;
  self->thread = 0;
  self->parentWaiting = 0;
  self->stopRequested = 0;
  *(undefined8 *)&self->stopRequest = 0;
  __cond = &self->cond;
  __mutex = &self->mtx;
  PaUnixMutex_Initialize(__mutex);
  paUtilErr_ = pthread_cond_init((pthread_cond_t *)__cond,(pthread_condattr_t *)0x0);
  if (paUtilErr_ != 0) {
    __assert_fail("0 == paUtilErr_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/os/unix/pa_unix_util.c"
                  ,0x115,
                  "PaError PaUnixThread_New(PaUnixThread *, void *(*)(void *), void *, PaTime, int)"
                 );
  }
  self->parentWaiting = -(uint)(waitForChild != 0.0) & 1;
  iVar2 = pthread_attr_init(&local_68);
  if (iVar2 != 0) {
    pcVar5 = 
    "Expression \'!pthread_attr_init( &attr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/os/unix/pa_unix_util.c\', line: 301\n"
    ;
LAB_0010d5f6:
    PaUtil_DebugPrint(pcVar5);
    return -0x2702;
  }
  iVar2 = pthread_attr_setscope(&local_68,0);
  if (iVar2 != 0) {
    pcVar5 = 
    "Expression \'!pthread_attr_setscope( &attr, PTHREAD_SCOPE_SYSTEM )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/os/unix/pa_unix_util.c\', line: 303\n"
    ;
    goto LAB_0010d5f6;
  }
  iVar2 = pthread_create(&self->thread,&local_68,(__start_routine *)threadFunc,threadArg);
  if (iVar2 != 0) {
    pcVar5 = 
    "Expression \'!pthread_create( &self->thread, &attr, threadFunc, threadArg )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/os/unix/pa_unix_util.c\', line: 305\n"
    ;
    goto LAB_0010d5f6;
  }
  if (rtSched == 0) {
LAB_0010d4a2:
    if (self->parentWaiting == 0) {
      return 0;
    }
    paUtilErr_ = PaUnixMutex_Lock(__mutex);
    if (paUtilErr_ < 0) {
      pcVar5 = 
      "Expression \'PaUnixMutex_Lock( &self->mtx )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/os/unix/pa_unix_util.c\', line: 361\n"
      ;
    }
    else {
      iVar2 = 0;
      gettimeofday(&local_90,(__timezone_ptr_t)0x0);
      if (self->parentWaiting != 0) {
        local_80 = (double)local_90.tv_usec * 1e-06 +
                   (double)CONCAT44(local_90.tv_sec._4_4_,(undefined4)local_90.tv_sec) +
                   waitForChild;
        dVar1 = floor(local_80);
        dVar6 = local_80 - dVar1;
        do {
          if (waitForChild <= 0.0) {
            iVar2 = pthread_cond_wait((pthread_cond_t *)__cond,(pthread_mutex_t *)__mutex);
          }
          else {
            local_78.tv_sec = (long)dVar1;
            local_78.tv_nsec = (long)(dVar6 * 1000000000.0);
            iVar2 = pthread_cond_timedwait
                              ((pthread_cond_t *)__cond,(pthread_mutex_t *)__mutex,&local_78);
          }
        } while ((self->parentWaiting != 0) && (iVar2 == 0));
      }
      paUtilErr_ = PaUnixMutex_Unlock(__mutex);
      if (paUtilErr_ < 0) {
        pcVar5 = 
        "Expression \'PaUnixMutex_Unlock( &self->mtx )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/os/unix/pa_unix_util.c\', line: 381\n"
        ;
      }
      else {
        if (iVar2 == 0) {
          return 0;
        }
        if (iVar2 != 0x6e) {
          PaUtil_DebugPrint(
                           "Expression \'!res || ETIMEDOUT == res\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/os/unix/pa_unix_util.c\', line: 383\n"
                           );
          PVar4 = -0x2702;
          goto LAB_0010d5c0;
        }
        paUtilErr_ = -0x2703;
        pcVar5 = 
        "Expression \'paTimedOut\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/os/unix/pa_unix_util.c\', line: 387\n"
        ;
      }
    }
  }
  else {
    local_90.tv_sec._0_4_ = 1;
    PVar4 = 1;
    iVar2 = pthread_setschedparam(self->thread,1,(sched_param *)&local_90);
    if (iVar2 == 0) {
LAB_0010d48a:
      paUtilErr_ = PVar4;
      pthread_getschedparam(self->thread,(int *)&local_90,(sched_param *)&local_78);
      goto LAB_0010d4a2;
    }
    piVar3 = __errno_location();
    PVar4 = 0;
    if (*piVar3 == 1) goto LAB_0010d48a;
    PaUtil_DebugPrint(
                     "Expression \'errno == EPERM\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/os/unix/pa_unix_util.c\', line: 256\n"
                     );
    paUtilErr_ = -0x2702;
    pcVar5 = 
    "Expression \'BoostPriority( self )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/os/unix/pa_unix_util.c\', line: 345\n"
    ;
  }
  PaUtil_DebugPrint(pcVar5);
  PVar4 = paUtilErr_;
LAB_0010d5c0:
  PaUnixThread_Terminate(self,0,(PaError *)0x0);
  return PVar4;
}

Assistant:

PaError PaUnixThread_New( PaUnixThread* self, void* (*threadFunc)( void* ), void* threadArg, PaTime waitForChild,
        int rtSched )
{
    PaError result = paNoError;
    pthread_attr_t attr;
    int started = 0;

    memset( self, 0, sizeof (PaUnixThread) );
    PaUnixMutex_Initialize( &self->mtx );
    PA_ASSERT_CALL( pthread_cond_init( &self->cond, NULL ), 0 );

    self->parentWaiting = 0 != waitForChild;

    /* Spawn thread */

/* Temporarily disabled since we should test during configuration for presence of required mman.h header */
#if 0
#if defined _POSIX_MEMLOCK && (_POSIX_MEMLOCK != -1)
    if( rtSched )
    {
        if( mlockall( MCL_CURRENT | MCL_FUTURE ) < 0 )
        {
            int savedErrno = errno;             /* In case errno gets overwritten */
            assert( savedErrno != EINVAL );     /* Most likely a programmer error */
            PA_UNLESS( (savedErrno == EPERM), paInternalError );
            PA_DEBUG(( "%s: Failed locking memory\n", __FUNCTION__ ));
        }
        else
            PA_DEBUG(( "%s: Successfully locked memory\n", __FUNCTION__ ));
    }
#endif
#endif

    PA_UNLESS( !pthread_attr_init( &attr ), paInternalError );
    /* Priority relative to other processes */
    PA_UNLESS( !pthread_attr_setscope( &attr, PTHREAD_SCOPE_SYSTEM ), paInternalError );   

    PA_UNLESS( !pthread_create( &self->thread, &attr, threadFunc, threadArg ), paInternalError );
    started = 1;

    if( rtSched )
    {
#if 0
        if( self->useWatchdog )
        {
            int err;
            struct sched_param wdSpm = { 0 };
            /* Launch watchdog, watchdog sets callback thread priority */
            int prio = PA_MIN( self->rtPrio + 4, sched_get_priority_max( SCHED_FIFO ) );
            wdSpm.sched_priority = prio;

            PA_UNLESS( !pthread_attr_init( &attr ), paInternalError );
            PA_UNLESS( !pthread_attr_setinheritsched( &attr, PTHREAD_EXPLICIT_SCHED ), paInternalError );
            PA_UNLESS( !pthread_attr_setscope( &attr, PTHREAD_SCOPE_SYSTEM ), paInternalError );
            PA_UNLESS( !pthread_attr_setschedpolicy( &attr, SCHED_FIFO ), paInternalError );
            PA_UNLESS( !pthread_attr_setschedparam( &attr, &wdSpm ), paInternalError );
            if( (err = pthread_create( &self->watchdogThread, &attr, &WatchdogFunc, self )) )
            {
                PA_UNLESS( err == EPERM, paInternalError );
                /* Permission error, go on without realtime privileges */
                PA_DEBUG(( "Failed bumping priority\n" ));
            }
            else
            {
                int policy;
                self->watchdogRunning = 1;
                PA_ENSURE_SYSTEM( pthread_getschedparam( self->watchdogThread, &policy, &wdSpm ), 0 );
                /* Check if priority is right, policy could potentially differ from SCHED_FIFO (but that's alright) */
                if( wdSpm.sched_priority != prio )
                {
                    PA_DEBUG(( "Watchdog priority not set correctly (%d)\n", wdSpm.sched_priority ));
                    PA_ENSURE( paInternalError );
                }
            }
        }
        else
#endif
            PA_ENSURE( BoostPriority( self ) );

        {
            int policy;
            struct sched_param spm;
            pthread_getschedparam(self->thread, &policy, &spm);
        }
    }
    
    if( self->parentWaiting )
    {
        PaTime till;
        struct timespec ts;
        int res = 0;
        PaTime now;

        PA_ENSURE( PaUnixMutex_Lock( &self->mtx ) );

        /* Wait for stream to be started */
        now = PaUtil_GetTime();
        till = now + waitForChild;

        while( self->parentWaiting && !res )
        {
            if( waitForChild > 0 )
            {
                ts.tv_sec = (time_t) floor( till );
                ts.tv_nsec = (long) ((till - floor( till )) * 1e9);
                res = pthread_cond_timedwait( &self->cond, &self->mtx.mtx, &ts );
            }
            else
            {
                res = pthread_cond_wait( &self->cond, &self->mtx.mtx );
            }
        }

        PA_ENSURE( PaUnixMutex_Unlock( &self->mtx ) );

        PA_UNLESS( !res || ETIMEDOUT == res, paInternalError );
        PA_DEBUG(( "%s: Waited for %g seconds for stream to start\n", __FUNCTION__, PaUtil_GetTime() - now ));
        if( ETIMEDOUT == res )
        {
            PA_ENSURE( paTimedOut );
        }
    }

end:
    return result;
error:
    if( started )
    {
        PaUnixThread_Terminate( self, 0, NULL );
    }

    goto end;
}